

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int handle_handshake_done_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  anon_struct_4_2_d91fd178_for_address_validation *paVar1;
  int iVar2;
  
  iVar2 = 0x2000a;
  if (((conn->super).local.bidi.next_stream_id & 1) == 0) {
    if (conn->initial != (st_quicly_handshake_space_t *)0x0) {
      __assert_fail("conn->initial == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x14c5,
                    "int handle_handshake_done_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                   );
    }
    if (conn->handshake == (st_quicly_handshake_space_t *)0x0) {
      iVar2 = 0;
    }
    else {
      paVar1 = &(conn->super).remote.address_validation;
      *(byte *)paVar1 = *(byte *)paVar1 & 0xfd;
      iVar2 = discard_handshake_context(conn,2);
      if (iVar2 == 0) {
        iVar2 = 0;
        update_loss_alarm(conn,0);
      }
    }
  }
  return iVar2;
}

Assistant:

static int handle_handshake_done_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    int ret;

    QUICLY_PROBE(HANDSHAKE_DONE_RECEIVE, conn, conn->stash.now);

    if (!quicly_is_client(conn))
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    assert(conn->initial == NULL);
    if (conn->handshake == NULL)
        return 0;

    conn->super.remote.address_validation.send_probe = 0;
    if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_HANDSHAKE)) != 0)
        return ret;
    update_loss_alarm(conn, 0);
    return 0;
}